

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

ssize_t cf_socket_recv(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t len,CURLcode *err)

{
  void *pvVar1;
  ulong uVar2;
  int *piVar3;
  char *pcVar4;
  curltime cVar5;
  undefined4 uStack_14c;
  char local_148 [8];
  char buffer [256];
  int sockerr;
  ssize_t nread;
  cf_socket_ctx *ctx;
  CURLcode *err_local;
  size_t len_local;
  char *buf_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  *err = CURLE_OK;
  *err = CURLE_OK;
  uVar2 = recv(*(int *)((long)pvVar1 + 0x98),buf,len,0);
  if (uVar2 == 0xffffffffffffffff) {
    piVar3 = __errno_location();
    buffer._252_4_ = *piVar3;
    if (((buffer._252_4_ == 0xb) || (buffer._252_4_ == 0xb)) || (buffer._252_4_ == 4)) {
      *err = CURLE_AGAIN;
    }
    else {
      pcVar4 = Curl_strerror(buffer._252_4_,local_148,0x100);
      Curl_failf(data,"Recv failure: %s",pcVar4);
      (data->state).os_errno = buffer._252_4_;
      *err = CURLE_RECV_ERROR;
    }
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"recv(len=%zu) -> %d, err=%d",len,uVar2 & 0xffffffff,(ulong)*err);
  }
  if ((0 < (long)uVar2) && ((*(byte *)((long)pvVar1 + 0x134) & 1) == 0)) {
    cVar5 = Curl_now();
    *(time_t *)((long)pvVar1 + 0x120) = cVar5.tv_sec;
    *(ulong *)((long)pvVar1 + 0x128) = CONCAT44(uStack_14c,cVar5.tv_usec);
    *(byte *)((long)pvVar1 + 0x134) = *(byte *)((long)pvVar1 + 0x134) & 0xfe | 1;
  }
  return uVar2;
}

Assistant:

static ssize_t cf_socket_recv(struct Curl_cfilter *cf, struct Curl_easy *data,
                              char *buf, size_t len, CURLcode *err)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  ssize_t nread;

  *err = CURLE_OK;

#ifdef DEBUGBUILD
  /* simulate network blocking/partial reads */
  if(cf->cft != &Curl_cft_udp && ctx->rblock_percent > 0) {
    unsigned char c = 0;
    Curl_rand(data, &c, 1);
    if(c >= ((100-ctx->rblock_percent)*256/100)) {
      CURL_TRC_CF(data, cf, "recv(len=%zu) SIMULATE EWOULDBLOCK", len);
      *err = CURLE_AGAIN;
      return -1;
    }
  }
  if(cf->cft != &Curl_cft_udp && ctx->recv_max && ctx->recv_max < len) {
    size_t orig_len = len;
    len = ctx->recv_max;
    CURL_TRC_CF(data, cf, "recv(len=%zu) SIMULATE max read of %zu bytes",
                orig_len, len);
  }
#endif

  *err = CURLE_OK;
  nread = sread(ctx->sock, buf, len);

  if(-1 == nread) {
    int sockerr = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == sockerr)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefore
         treat both error codes the same here */
      (EWOULDBLOCK == sockerr) || (EAGAIN == sockerr) || (EINTR == sockerr)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      *err = CURLE_AGAIN;
    }
    else {
      char buffer[STRERROR_LEN];

      failf(data, "Recv failure: %s",
            Curl_strerror(sockerr, buffer, sizeof(buffer)));
      data->state.os_errno = sockerr;
      *err = CURLE_RECV_ERROR;
    }
  }

  CURL_TRC_CF(data, cf, "recv(len=%zu) -> %d, err=%d", len, (int)nread,
              *err);
  if(nread > 0 && !ctx->got_first_byte) {
    ctx->first_byte_at = Curl_now();
    ctx->got_first_byte = TRUE;
  }
  return nread;
}